

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

action Search::single_prediction_LDF
                 (search_private *priv,example *ecs,size_t ec_cnt,int policy,float *a_cost,
                 action override_action)

{
  label *this;
  example *target;
  wclass **ppwVar1;
  int iVar2;
  action aVar3;
  uint64_t uVar4;
  BaseTask *pBVar5;
  label_t lVar6;
  wclass *pwVar7;
  size_t sVar8;
  v_array<Search::action_cache> *pvVar9;
  search_private *psVar10;
  bool bVar11;
  uint uVar12;
  multi_learner *pmVar13;
  long *plVar14;
  action_cache *__ptr;
  ulong uVar15;
  action aVar16;
  long lVar17;
  bool bVar18;
  float fVar19;
  v_array<Search::action_cache> *this_cache;
  multi_ex tmp;
  polylabel old_label;
  wclass wc;
  float local_ec;
  v_array<Search::action_cache> *local_e0;
  action local_d4;
  search_private *local_d0;
  long *local_c8;
  long *plStack_c0;
  undefined8 local_b8;
  float *local_a8;
  action_cache local_a0;
  size_t local_90;
  ulong local_88;
  label *local_80;
  label_t local_78;
  label_t lStack_70;
  wclass *local_68;
  size_t sStack_60;
  size_t local_58;
  wclass local_48;
  
  bVar18 = true;
  if ((((priv->state != INIT_TRAIN) || (priv->metatask == (search_metatask *)0x0)) ||
      (priv->metaoverride == (BaseTask *)0x0)) &&
     ((priv->metaoverride == (BaseTask *)0x0 ||
      (priv->metaoverride->_foreach_action ==
       (_func_void_search_ptr_size_t_float_action_bool_float *)0x0)))) {
    bVar18 = override_action != 0xffffffff;
  }
  this = &priv->ldf_test_label;
  local_a8 = a_cost;
  local_90 = ec_cnt;
  (*(code *)COST_SENSITIVE::cs_label)(this);
  local_48.x = 0.0;
  local_48.class_index = 1;
  local_48.partial_prediction = 0.0;
  local_48.wap_value = 0.0;
  local_80 = this;
  v_array<COST_SENSITIVE::wclass>::push_back(&this->costs,&local_48);
  if (priv->is_ldf == true) {
    bVar11 = COST_SENSITIVE::ec_is_example_header(ecs);
  }
  else {
    bVar11 = false;
  }
  uVar12 = (uint)bVar11;
  local_e0 = (v_array<Search::action_cache> *)0x0;
  if (bVar18) {
    local_e0 = (v_array<Search::action_cache> *)operator_new(0x20);
    local_e0->_begin = (action_cache *)0x0;
    local_e0->_end = (action_cache *)0x0;
    local_e0->end_array = (action_cache *)0x0;
    local_e0->erase_count = 0;
  }
  local_d0 = priv;
  if (uVar12 < local_90) {
    local_88 = (ulong)(uint)policy;
    local_d4 = 0;
    local_ec = 0.0;
    uVar15 = (ulong)uVar12;
    do {
      if (uVar12 != 0) {
        LabelDict::add_example_namespaces_from_example(ecs + uVar15,ecs);
      }
      target = ecs + uVar15;
      local_58 = ecs[uVar15].l.cb_eval.event.costs.erase_count;
      local_78 = ecs[uVar15].l.multi;
      lStack_70 = (&ecs[uVar15].l.multi)[1];
      ppwVar1 = &ecs[uVar15].l.cs.costs.end_array;
      local_68 = *ppwVar1;
      sStack_60 = (size_t)ppwVar1[1];
      lVar6 = (label_t)(local_80->costs)._end;
      pwVar7 = (local_80->costs).end_array;
      sVar8 = (local_80->costs).erase_count;
      ecs[uVar15].l.multi = (label_t)(local_80->costs)._begin;
      (&ecs[uVar15].l.multi)[1] = lVar6;
      ppwVar1 = &ecs[uVar15].l.cs.costs.end_array;
      *ppwVar1 = pwVar7;
      ppwVar1[1] = (wclass *)sVar8;
      local_c8 = (long *)0x0;
      plStack_c0 = (long *)0x0;
      local_b8 = 0;
      uVar4 = ecs[uVar15].super_example_predict.ft_offset;
      ecs[uVar15].super_example_predict.ft_offset = local_d0->offset;
      local_a0._0_8_ = target;
      std::vector<example*,std::allocator<example*>>::_M_realloc_insert<example*>
                ((vector<example*,std::allocator<example*>> *)&local_c8,(iterator)0x0,
                 (example **)&local_a0);
      pmVar13 = LEARNER::as_multiline<char,char>(local_d0->base_learner);
      if (local_c8 != plStack_c0) {
        iVar2 = *(int *)(pmVar13 + 0xe0);
        plVar14 = local_c8;
        do {
          *(long *)(*plVar14 + 0x6820) =
               *(long *)(*plVar14 + 0x6820) + (ulong)(uint)(iVar2 * (int)local_88);
          plVar14 = plVar14 + 1;
        } while (plVar14 != plStack_c0);
      }
      (**(code **)(pmVar13 + 0x30))
                (*(undefined8 *)(pmVar13 + 0x18),*(undefined8 *)(pmVar13 + 0x20),&local_c8);
      if (local_c8 != plStack_c0) {
        iVar2 = *(int *)(pmVar13 + 0xe0);
        plVar14 = local_c8;
        do {
          *(long *)(*plVar14 + 0x6820) =
               *(long *)(*plVar14 + 0x6820) - (ulong)(uint)(iVar2 * (int)local_88);
          plVar14 = plVar14 + 1;
        } while (plVar14 != plStack_c0);
      }
      (target->super_example_predict).ft_offset = uVar4;
      aVar16 = (action)uVar15;
      if (override_action == 0xffffffff) {
        if ((aVar16 == uVar12) ||
           (target->partial_prediction <= local_ec && local_ec != target->partial_prediction)) {
          fVar19 = target->partial_prediction;
          local_ec = fVar19;
          local_d4 = aVar16;
          goto LAB_0024c96d;
        }
      }
      else if (aVar16 == override_action) {
        fVar19 = target->partial_prediction;
LAB_0024c96d:
        *local_a8 = fVar19;
      }
      if (local_e0 != (v_array<Search::action_cache> *)0x0) {
        local_a0.cost = target->partial_prediction;
        local_a0._0_8_ = uVar15 << 0x20;
        local_a0.is_opt = false;
        v_array<Search::action_cache>::push_back(local_e0,&local_a0);
      }
      local_d0->num_features = local_d0->num_features + target->num_features;
      ecs[uVar15].l.cb_eval.event.costs.erase_count = local_58;
      ecs[uVar15].l.cs.costs.end_array = local_68;
      ecs[uVar15].l.cs.costs.erase_count = sStack_60;
      ecs[uVar15].l.multi = local_78;
      ecs[uVar15].l.cs.costs._end = (wclass *)lStack_70;
      if (uVar12 != 0) {
        LabelDict::del_example_namespaces_from_example(target,ecs);
      }
      if (local_c8 != (long *)0x0) {
        operator_delete(local_c8);
      }
      uVar15 = (ulong)(aVar16 + 1);
    } while (uVar15 < local_90);
  }
  else {
    local_ec = 0.0;
    local_d4 = 0;
  }
  psVar10 = local_d0;
  aVar16 = override_action;
  if (override_action == 0xffffffff) {
    *local_a8 = local_ec;
    aVar16 = local_d4;
  }
  if (local_e0 != (v_array<Search::action_cache> *)0x0) {
    __ptr = local_e0->_begin;
    if (local_e0->_end != __ptr) {
      lVar17 = 0xc;
      uVar15 = 0;
      do {
        fVar19 = *local_a8;
        *(float *)((long)__ptr + lVar17 + -0xc) = fVar19;
        aVar3 = *(action *)((long)__ptr + lVar17 + -8);
        *(bool *)((long)__ptr + lVar17 + -4) = aVar3 == aVar16;
        pBVar5 = psVar10->metaoverride;
        if ((pBVar5 != (BaseTask *)0x0) &&
           (pBVar5->_foreach_action != (_func_void_search_ptr_size_t_float_action_bool_float *)0x0))
        {
          (*pBVar5->_foreach_action)
                    (pBVar5->sch,psVar10->t - 1,fVar19,aVar3,aVar3 == aVar16,
                     *(float *)((long)&__ptr->min_cost + lVar17));
        }
        uVar15 = uVar15 + 1;
        __ptr = local_e0->_begin;
        lVar17 = lVar17 + 0x10;
      } while (uVar15 < (ulong)((long)local_e0->_end - (long)__ptr >> 4));
    }
    pvVar9 = local_e0;
    bVar18 = false;
    if ((psVar10->state == INIT_TRAIN) &&
       (bVar18 = false, psVar10->metatask != (search_metatask *)0x0)) {
      bVar18 = psVar10->metaoverride != (BaseTask *)0x0;
    }
    if ((override_action == 0xffffffff) && (bVar18)) {
      v_array<v_array<Search::action_cache>_*>::push_back(&psVar10->memo_foreach_action,&local_e0);
    }
    else {
      if (__ptr != (action_cache *)0x0) {
        free(__ptr);
      }
      pvVar9->_begin = (action_cache *)0x0;
      pvVar9->_end = (action_cache *)0x0;
      pvVar9->end_array = (action_cache *)0x0;
      if (local_e0 != (v_array<Search::action_cache> *)0x0) {
        operator_delete(local_e0);
      }
    }
  }
  psVar10->total_predictions_made = psVar10->total_predictions_made + 1;
  return aVar16;
}

Assistant:

action single_prediction_LDF(search_private& priv, example* ecs, size_t ec_cnt, int policy, float& a_cost,
    action override_action)  // if override_action != -1, then we return it as the action and a_cost is set to the
                             // appropriate cost for that action
{
  bool need_partial_predictions = need_memo_foreach_action(priv) ||
      (priv.metaoverride && priv.metaoverride->_foreach_action) || (override_action != (action)-1);

  CS::cs_label.default_label(&priv.ldf_test_label);
  CS::wclass wc = {0., 1, 0., 0.};
  priv.ldf_test_label.costs.push_back(wc);

  // keep track of best (aka chosen) action
  float best_prediction = 0.;
  action best_action = 0;

  size_t start_K = (priv.is_ldf && COST_SENSITIVE::ec_is_example_header(ecs[0])) ? 1 : 0;

  v_array<action_cache>* this_cache = nullptr;
  if (need_partial_predictions)
  {
    this_cache = new v_array<action_cache>();
    *this_cache = v_init<action_cache>();
  }

  for (action a = (uint32_t)start_K; a < ec_cnt; a++)
  {
    cdbg << "== single_prediction_LDF a=" << a << "==" << endl;
    if (start_K > 0)
      LabelDict::add_example_namespaces_from_example(ecs[a], ecs[0]);

    polylabel old_label = ecs[a].l;
    ecs[a].l.cs = priv.ldf_test_label;

    multi_ex tmp;
    uint64_t old_offset = ecs[a].ft_offset;
    ecs[a].ft_offset = priv.offset;
    tmp.push_back(&ecs[a]);
    as_multiline(priv.base_learner)->predict(tmp, policy);

    ecs[a].ft_offset = old_offset;
    cdbg << "partial_prediction[" << a << "] = " << ecs[a].partial_prediction << endl;

    if (override_action != (action)-1)
    {
      if (a == override_action)
        a_cost = ecs[a].partial_prediction;
    }
    else if ((a == start_K) || (ecs[a].partial_prediction < best_prediction))
    {
      best_prediction = ecs[a].partial_prediction;
      best_action = a;
      a_cost = best_prediction;
    }
    if (this_cache)
      this_cache->push_back(action_cache(0., a, false, ecs[a].partial_prediction));

    priv.num_features += ecs[a].num_features;
    ecs[a].l = old_label;
    if (start_K > 0)
      LabelDict::del_example_namespaces_from_example(ecs[a], ecs[0]);
  }
  if (override_action != (action)-1)
    best_action = override_action;
  else
    a_cost = best_prediction;

  if (this_cache)
  {
    for (size_t i = 0; i < this_cache->size(); i++)
    {
      action_cache& ac = (*this_cache)[i];
      ac.min_cost = a_cost;
      ac.is_opt = (ac.k == best_action);
      if (priv.metaoverride && priv.metaoverride->_foreach_action)
        priv.metaoverride->_foreach_action(*priv.metaoverride->sch, priv.t - 1, ac.min_cost, ac.k, ac.is_opt, ac.cost);
    }
    if (need_memo_foreach_action(priv) && (override_action == (action)-1))
      priv.memo_foreach_action.push_back(this_cache);
    else
    {
      this_cache->delete_v();
      delete this_cache;
    }
  }

  // TODO: generate raw predictions if necessary

  priv.total_predictions_made++;
  return best_action;
}